

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start,bool type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int start_00;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  type t;
  ulong local_f0;
  ulong local_d0;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  uVar9 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar10 = end - 1;
    local_f0 = (ulong)uVar10;
    uVar11 = uVar10 - start;
    if (0x18 < (int)uVar11) {
LAB_003425de:
      start_00 = (int)uVar9;
      iVar12 = (uVar11 >> 1) + start_00;
      iVar8 = keys[iVar12];
      lVar4 = (long)start_00;
      uVar10 = (uint)local_f0;
      lVar5 = (long)(int)uVar10;
      uVar15 = local_f0 & 0xffffffff;
      local_d0 = uVar9;
      do {
        iVar2 = (int)local_d0;
        iVar13 = (int)uVar15;
        if ((type & 1U) == 0) {
          if (iVar2 < (int)uVar10) {
            piVar7 = keys + iVar2;
            do {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a0,compare,*piVar7,iVar8);
              if (local_a0.fpclass == cpp_dec_float_NaN) goto LAB_00342841;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_68,0,(type *)0x0);
              iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_a0,&local_68);
              if (0 < iVar2) goto LAB_00342841;
              uVar11 = (int)local_d0 + 1;
              piVar7 = piVar7 + 1;
              local_d0 = (ulong)uVar11;
            } while (uVar10 != uVar11);
            local_d0 = local_f0 & 0xffffffff;
          }
LAB_00342841:
          if (start_00 < iVar13) {
            uVar15 = (ulong)iVar13;
            while( true ) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a0,compare,keys[uVar15],iVar8);
              if (local_a0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_68,0,(type *)0x0);
              iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_a0,&local_68);
              if ((iVar2 < 1) || (uVar15 = uVar15 - 1, (long)uVar15 <= lVar4)) break;
            }
          }
        }
        else {
          if (iVar2 < (int)uVar10) {
            lVar6 = 0;
            do {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a0,compare,keys[iVar2 + lVar6],iVar8);
              if (local_a0.fpclass == cpp_dec_float_NaN) {
                local_d0 = (ulong)(uint)(iVar2 + (int)lVar6);
                goto LAB_003427b2;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_68,0,(type *)0x0);
              iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_a0,&local_68);
              if (-1 < iVar1) {
                local_d0 = (ulong)(uint)(iVar2 + (int)lVar6);
                goto LAB_003427b2;
              }
              lVar6 = lVar6 + 1;
            } while (lVar5 - iVar2 != lVar6);
            local_d0 = local_f0 & 0xffffffff;
          }
LAB_003427b2:
          if (start_00 < iVar13) {
            uVar15 = (ulong)iVar13;
            while( true ) {
              Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a0,compare,keys[uVar15],iVar8);
              if (local_a0.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_68,0,(type *)0x0);
              iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_a0,&local_68);
              if ((iVar2 < 0) || (uVar15 = uVar15 - 1, (long)uVar15 <= lVar4)) break;
            }
          }
        }
        iVar2 = (int)local_d0;
        iVar13 = (int)uVar15;
        if (iVar13 <= iVar2) goto LAB_003428e5;
        iVar1 = keys[iVar2];
        keys[iVar2] = keys[iVar13];
        keys[iVar13] = iVar1;
        local_d0 = (ulong)(iVar2 + 1);
        uVar15 = (ulong)(iVar13 - 1);
      } while( true );
    }
LAB_00342af1:
    local_f0._0_4_ = uVar10;
    if (0 < (int)uVar11) {
      SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
                (keys,(uint)local_f0,compare,start);
    }
  }
  return;
LAB_003428e5:
  if ((type & 1U) == 0) {
    if (start_00 < iVar13) {
      uVar15 = (ulong)iVar13;
      while (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_a0,compare,iVar8,keys[uVar15]),
            local_a0.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_68,0,(type *)0x0);
        iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_a0,&local_68);
        if ((0 < iVar2) || (uVar15 = uVar15 - 1, (long)uVar15 <= lVar4)) break;
      }
    }
    if ((uint)uVar15 == uVar10) {
      iVar8 = keys[lVar5];
      keys[lVar5] = keys[iVar12];
      keys[iVar12] = iVar8;
      uVar15 = (ulong)(uVar10 - 1);
    }
  }
  else {
    if (iVar2 < (int)uVar10) {
      piVar7 = keys + iVar2;
      do {
        Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a0,compare,iVar8,*piVar7);
        if (local_a0.fpclass == cpp_dec_float_NaN) goto LAB_00342a60;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_68,0,(type *)0x0);
        iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_a0,&local_68);
        if (iVar2 < 0) goto LAB_00342a60;
        uVar11 = (int)local_d0 + 1;
        piVar7 = piVar7 + 1;
        local_d0 = (ulong)uVar11;
      } while (uVar10 != uVar11);
      local_d0 = local_f0 & 0xffffffff;
    }
LAB_00342a60:
    if ((int)local_d0 == start_00) {
      iVar8 = keys[lVar4];
      keys[lVar4] = keys[iVar12];
      keys[iVar12] = iVar8;
      local_d0 = (ulong)(start_00 + 1);
    }
  }
  uVar3 = (uint)uVar15;
  uVar11 = uVar3 - start_00;
  iVar8 = (int)local_d0;
  uVar14 = uVar10 - iVar8;
  if ((int)uVar14 < (int)uVar11) {
    local_d0 = uVar9;
    uVar14 = uVar11;
    uVar3 = uVar10;
    start_00 = iVar8;
    local_f0 = uVar15;
    if ((int)uVar10 <= iVar8) goto LAB_00342adc;
  }
  else {
    uVar9 = local_d0;
    uVar11 = uVar14;
    if ((int)uVar3 <= start_00) goto LAB_00342adc;
  }
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (keys,uVar3 + 1,compare,start_00,(bool)(~type & 1));
  uVar9 = local_d0;
  uVar11 = uVar14;
LAB_00342adc:
  start = (int)uVar9;
  type = (bool)(type ^ 1);
  uVar10 = (uint)local_f0;
  if ((int)uVar11 < 0x19) goto LAB_00342af1;
  goto LAB_003425de;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}